

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * AddWindowSettings(char *name)

{
  ImU32 IVar1;
  value_type *pvVar2;
  char *pcVar3;
  ImVector<ImGuiWindowSettings> *this;
  value_type vStack_38;
  
  this = &GImGui->SettingsWindows;
  vStack_38._16_5_ = 0;
  vStack_38._21_8_ = 0;
  vStack_38.Name = (char *)0x0;
  vStack_38._8_5_ = 0;
  vStack_38.Pos.x._1_3_ = 0;
  ImVector<ImGuiWindowSettings>::push_back(this,&vStack_38);
  pvVar2 = ImVector<ImGuiWindowSettings>::back(this);
  pcVar3 = ImStrdup(name);
  pvVar2->Name = pcVar3;
  IVar1 = ImHash(name,0,0);
  pvVar2->Id = IVar1;
  return pvVar2;
}

Assistant:

static ImGuiWindowSettings* AddWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->Id = ImHash(name, 0);
    return settings;
}